

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_attribute_struct *
pugi::impl::anon_unknown_0::append_new_attribute(xml_node_struct *node,xml_allocator *alloc)

{
  ulong uVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_memory_page *local_10;
  
  uVar1 = alloc->_busy_size + 0x28;
  if (uVar1 < 0x7fd9) {
    local_10 = alloc->_root;
    pxVar4 = (xml_attribute_struct *)((long)&local_10[1].allocator + alloc->_busy_size);
    alloc->_busy_size = uVar1;
  }
  else {
    pxVar4 = (xml_attribute_struct *)xml_allocator::allocate_memory_oob(alloc,0x28,&local_10);
    if (pxVar4 == (xml_attribute_struct *)0x0) {
      return (xml_attribute_struct *)0x0;
    }
  }
  pxVar4->prev_attribute_c = (xml_attribute_struct *)0x0;
  pxVar4->next_attribute = (xml_attribute_struct *)0x0;
  pxVar4->name = (char_t *)0x0;
  pxVar4->value = (char_t *)0x0;
  pxVar4->header = ((long)pxVar4 - (long)local_10) * 0x100;
  pxVar2 = node->first_attribute;
  if (pxVar2 == (xml_attribute_struct *)0x0) {
    node->first_attribute = pxVar4;
    pxVar2 = pxVar4;
  }
  else {
    pxVar3 = pxVar2->prev_attribute_c;
    pxVar3->next_attribute = pxVar4;
    pxVar4->prev_attribute_c = pxVar3;
  }
  pxVar2->prev_attribute_c = pxVar4;
  return pxVar4;
}

Assistant:

PUGI__FN_NO_INLINE xml_attribute_struct* append_new_attribute(xml_node_struct* node, xml_allocator& alloc)
	{
		if (!alloc.reserve()) return 0;

		xml_attribute_struct* attr = allocate_attribute(alloc);
		if (!attr) return 0;

		append_attribute(attr, node);

		return attr;
	}